

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_AddArrayToObject(cJSON *object,char *name)

{
  cJSON_bool cVar1;
  cJSON *array;
  char *name_local;
  cJSON *object_local;
  
  object_local = cJSON_CreateArray();
  cVar1 = add_item_to_object(object,name,object_local,&global_hooks,0);
  if (cVar1 == 0) {
    cJSON_Delete(object_local);
    object_local = (cJSON *)0x0;
  }
  return object_local;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddArrayToObject(cJSON * const object, const char * const name)
{
    cJSON *array = cJSON_CreateArray();
    if (add_item_to_object(object, name, array, &global_hooks, false))
    {
        return array;
    }

    cJSON_Delete(array);
    return NULL;
}